

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O3

int __thiscall
ADPlanner::replan(ADPlanner *this,vector<int,_std::allocator<int>_> *solution_stateIDs_V,
                 ReplanParams params,int *solcost)

{
  undefined1 auVar1 [16];
  int iVar2;
  
  this->finitial_eps = params.initial_eps;
  auVar1._8_4_ = params.final_eps._0_4_;
  auVar1._0_8_ = params.dec_eps;
  auVar1._12_4_ = params.final_eps._4_4_;
  this->dec_eps = params.dec_eps;
  this->final_epsilon = (double)auVar1._8_8_;
  this->bsearchuntilfirstsolution = params.return_first_solution;
  this->use_repair_time = 0.0 < params.repair_time;
  this->repair_time = params.repair_time;
  iVar2 = (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[1])(params.max_time._0_4_);
  return iVar2;
}

Assistant:

int ADPlanner::replan(vector<int>* solution_stateIDs_V, ReplanParams params, int* solcost)
{
    finitial_eps = params.initial_eps;
    final_epsilon = params.final_eps;
    dec_eps = params.dec_eps;
    bsearchuntilfirstsolution = params.return_first_solution;
    use_repair_time = params.repair_time > 0;
    repair_time = params.repair_time;
    return replan(params.max_time, solution_stateIDs_V, solcost);
}